

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O3

void __thiscall
duckdb::Linenoise::AddErrorHighlighting
          (Linenoise *this,idx_t render_start,idx_t render_end,
          vector<duckdb::highlightToken,_true> *tokens)

{
  undefined1 *puVar1;
  byte bVar2;
  ulong uVar3;
  size_t sVar4;
  undefined7 uVar5;
  pointer puVar6;
  reference pvVar7;
  size_t *psVar8;
  reference pvVar9;
  long lVar10;
  vector<unsigned_long,_true> *brackets_00;
  undefined1 *puVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar15;
  pointer phVar16;
  byte *pbVar17;
  iterator __end1;
  size_type __n;
  char *__end;
  ulong uVar18;
  unsigned_long *error;
  pointer puVar19;
  vector<duckdb::highlightToken,_true> new_tokens;
  idx_t quote_pos;
  vector<unsigned_long,_true> comment_start;
  vector<unsigned_long,_true> errors;
  vector<unsigned_long,_true> comment_end;
  vector<unsigned_long,_true> cursor_brackets;
  vector<unsigned_long,_true> curly_brackets;
  vector<unsigned_long,_true> square_brackets;
  vector<unsigned_long,_true> brackets;
  string dollar_quote_marker;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> local_188;
  highlightToken local_170;
  pointer local_150;
  vector<unsigned_long,_true> local_148;
  idx_t local_130;
  vector<unsigned_long,_true> local_128;
  ulong local_108;
  idx_t local_100;
  vector<unsigned_long,_true> local_f8;
  vector<unsigned_long,_true> local_d8;
  ulong local_b8;
  size_t *local_b0;
  vector<unsigned_long,_true> local_a8;
  vector<unsigned_long,_true> local_88;
  vector<unsigned_long,_true> local_68;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  uint uVar14;
  
  if (enableErrorRendering != '\0') {
    return;
  }
  puVar11 = (undefined1 *)this->len;
  if ((undefined1 *)0x7cf < puVar11) {
    return;
  }
  local_b0 = &this->len;
  local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (unsigned_long *)0x0;
  local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (ulong *)0x0;
  local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (ulong *)0x0;
  local_d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (ulong *)0x0;
  local_d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (ulong *)0x0;
  local_148.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (unsigned_long *)0x0;
  local_148.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (unsigned_long *)0x0;
  local_148.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (unsigned_long *)0x0;
  local_f8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  local_150 = (pointer)0x0;
  local_188.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_130 = render_start;
  local_100 = render_end;
  if (puVar11 != (undefined1 *)0x0) {
    pbVar17 = (byte *)this->buf;
    bVar2 = *pbVar17;
    do {
      uVar12 = (uint)bVar2;
      uVar13 = 0;
      uVar14 = 0;
      if (uVar12 == 0x5a || bVar2 < 0x5a) {
        if (uVar12 - 0x22 < 0xc) {
          brackets_00 = &local_68;
          switch(uVar12) {
          case 0x22:
            uVar13 = 2;
            local_150 = local_188.
                        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            break;
          case 0x24:
            puVar1 = &(local_188.
                       super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0x1;
            uVar13 = uVar14;
            if (puVar1 < puVar11) {
              bVar2 = pbVar17[(long)puVar1];
              phVar16 = (pointer)puVar1;
              while (bVar2 != 0x24) {
                if ((((0x19 < (byte)(bVar2 + 0xbf)) &&
                     (-1 < (char)bVar2 && 0x19 < (byte)(bVar2 + 0x9f))) &&
                    ((phVar16 <= puVar1 || (9 < (byte)(bVar2 - 0x30))))) ||
                   (phVar16 = (pointer)&phVar16->field_0x1, puVar11 <= phVar16))
                goto switchD_0021aa31_caseD_23;
                bVar2 = pbVar17[(long)phVar16];
              }
              if (phVar16 != (pointer)0x0) {
                local_150 = local_188.
                            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                local_188.
                super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
                _M_impl.super__Vector_impl_data._M_start = phVar16;
                local_170._0_8_ = (void *)((long)&local_170 + 0x10U);
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_170,pbVar17 + (long)puVar1,pbVar17 + (long)phVar16);
                ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_170);
                if ((void *)local_170._0_8_ != (void *)((long)&local_170 + 0x10U)) {
                  operator_delete((void *)local_170._0_8_);
                }
                uVar13 = 4;
              }
            }
            break;
          case 0x27:
            local_150 = local_188.
                        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            uVar13 = 1;
            break;
          case 0x28:
            goto switchD_0021aa31_caseD_28;
          case 0x29:
            goto switchD_0021aa31_caseD_29;
          case 0x2d:
            uVar13 = uVar14;
            if ((&(local_188.
                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                   ._M_impl.super__Vector_impl_data._M_start)->field_0x1 < puVar11) &&
               (pbVar17[(long)&(local_188.
                                super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_0x1] == 0x2d)) {
              if (local_148.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_148.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_148,
                           (iterator)
                           local_148.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish,(unsigned_long *)&local_188);
              }
              else {
                *local_148.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish =
                     (unsigned_long)
                     local_188.
                     super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_148.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_148.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              local_188.
              super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)&(local_188.
                              super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_0x1;
              uVar13 = 3;
            }
          }
        }
      }
      else if (uVar12 == 0x7a || bVar2 < 0x7a) {
        if (uVar12 == 0x5b) {
          brackets_00 = &local_88;
switchD_0021aa31_caseD_28:
          OpenBracket(brackets_00,&local_d8,this->pos,
                      (idx_t)local_188.
                             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          uVar13 = uVar14;
        }
        else if (uVar12 == 0x5d) {
          brackets_00 = &local_88;
switchD_0021aa31_caseD_29:
          CloseBracket(brackets_00,&local_d8,this->pos,
                       (idx_t)local_188.
                              super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                              ._M_impl.super__Vector_impl_data._M_start,&local_128);
          uVar13 = uVar14;
        }
      }
      else {
        if (uVar12 == 0x7b) {
          brackets_00 = &local_a8;
          goto switchD_0021aa31_caseD_28;
        }
        uVar13 = uVar14;
        if (uVar12 == 0x7d) {
          brackets_00 = &local_a8;
          goto switchD_0021aa31_caseD_29;
        }
      }
switchD_0021aa31_caseD_23:
      local_188.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)&(local_188.
                      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_0x1;
      puVar11 = (undefined1 *)*local_b0;
      if (puVar11 <=
          local_188.
          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
          _M_impl.super__Vector_impl_data._M_start) goto LAB_0021a430;
      pbVar17 = (byte *)this->buf;
      bVar2 = pbVar17[(long)local_188.
                            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            ._M_impl.super__Vector_impl_data._M_start];
    } while( true );
  }
LAB_0021a46d:
  HandleBracketErrors((duckdb *)
                      local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (vector<unsigned_long,_true> *)
                      local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish,&local_128);
  HandleBracketErrors((duckdb *)
                      local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (vector<unsigned_long,_true> *)
                      local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish,&local_128);
  HandleBracketErrors((duckdb *)
                      local_a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (vector<unsigned_long,_true> *)
                      local_a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish,&local_128);
  puVar6 = local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar19 = local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_170._0_8_ = (void *)((long)&local_170 + 0x10U);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_170,"Error found at position %llu\n","");
      if ((void *)local_170._0_8_ != (void *)((long)&local_170 + 0x10U)) {
        operator_delete((void *)local_170._0_8_);
      }
      uVar18 = *puVar19;
      if (uVar18 <= local_100 && local_130 <= uVar18) {
        InsertToken(TOKEN_ERROR,uVar18 - local_130,tokens);
      }
      puVar19 = puVar19 + 1;
    } while (puVar19 != puVar6);
  }
  puVar6 = local_d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)local_d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == 0x10 ||
      local_d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    if (local_d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      puVar19 = local_d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        local_170._0_8_ = (void *)((long)&local_170 + 0x10U);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_170,"Highlight bracket at position %d\n","");
        if ((void *)local_170._0_8_ != (void *)((long)&local_170 + 0x10U)) {
          operator_delete((void *)local_170._0_8_);
        }
        uVar18 = *puVar19;
        if (uVar18 <= local_100 && local_130 <= uVar18) {
          InsertToken(TOKEN_BRACKET,uVar18 - local_130,tokens);
        }
        puVar19 = puVar19 + 1;
      } while (puVar19 != puVar6);
    }
  }
  else {
    local_d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  if (local_148.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_148.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_188.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::reserve
              (&local_188,
               ((long)(tokens->
                      super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>)
                      .
                      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(tokens->
                      super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>)
                      .
                      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    if (local_148.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_148.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      __n = 0;
    }
    else {
      uVar18 = 0;
      __n = 0;
      do {
        pvVar7 = vector<unsigned_long,_true>::operator[](&local_148,uVar18);
        uVar3 = *pvVar7;
        psVar8 = local_b0;
        if (uVar18 < (ulong)((long)local_f8.
                                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_f8.
                                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3)) {
          psVar8 = vector<unsigned_long,_true>::operator[](&local_f8,uVar18);
        }
        local_108 = *psVar8;
        uVar15 = uVar3 - local_130;
        if (local_108 <= local_100 && local_130 <= uVar3) {
          local_170._0_8_ = (void *)((long)&local_170 + 0x10U);
          local_b8 = uVar18;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_170,"Comment at position %d to %d\n","");
          if ((void *)local_170._0_8_ != (void *)((long)&local_170 + 0x10U)) {
            operator_delete((void *)local_170._0_8_);
          }
          uVar18 = local_b8;
          local_170.type = 5;
          local_170.search_match = false;
          local_170.start = uVar15;
          if (__n < (ulong)(((long)(tokens->
                                   super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                   ).
                                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(tokens->
                                   super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                   ).
                                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555)) {
            local_108 = local_108 - local_130;
LAB_0021a726:
            pvVar9 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n);
            if (pvVar9->start < uVar15) goto code_r0x0021a73b;
            if (local_188.
                super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_188.
                super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
              _M_realloc_insert<duckdb::highlightToken_const&>
                        ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)
                         &local_188,
                         (iterator)
                         local_188.
                         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_170);
            }
            else {
              *(ulong *)&(local_188.
                          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->search_match =
                   CONCAT71(local_170._17_7_,local_170.search_match);
              (local_188.
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_finish)->type = local_170.type;
              *(undefined7 *)
               &(local_188.
                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->field_0x1 = local_170._1_7_;
              (local_188.
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_finish)->start = local_170.start;
              local_188.
              super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_188.
                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            lVar10 = (long)(tokens->
                           super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                           ).
                           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(tokens->
                           super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                           ).
                           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            while ((__n < (ulong)((lVar10 >> 3) * -0x5555555555555555) &&
                   (pvVar9 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n),
                   pvVar9->start <= local_108))) {
              lVar10 = (long)(tokens->
                             super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                             ).
                             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(tokens->
                             super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                             ).
                             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              __n = __n + 1;
            }
            goto LAB_0021a7d3;
          }
LAB_0021a7a1:
          if (local_188.
              super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_188.
              super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
            _M_realloc_insert<duckdb::highlightToken_const&>
                      ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)
                       &local_188,
                       (iterator)
                       local_188.
                       super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_170);
          }
          else {
            *(ulong *)&(local_188.
                        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->search_match =
                 CONCAT71(local_170._17_7_,local_170.search_match);
            (local_188.
             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_finish)->type = local_170.type;
            *(undefined7 *)
             &(local_188.
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_finish)->field_0x1 = local_170._1_7_;
            (local_188.
             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_finish)->start = local_170.start;
            local_188.
            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_188.
                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
LAB_0021a7d3:
        uVar18 = uVar18 + 1;
      } while (uVar18 < (ulong)((long)local_148.
                                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_148.
                                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    phVar16 = (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
              ).super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (__n < (ulong)(((long)(tokens->
                             super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                             ).
                             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)phVar16 >> 3) *
                     -0x5555555555555555)) {
      do {
        pvVar9 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n);
        if (local_188.
            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_188.
            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
          _M_realloc_insert<duckdb::highlightToken_const&>
                    ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)
                     &local_188,
                     (iterator)
                     local_188.
                     super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                     ._M_impl.super__Vector_impl_data._M_finish,pvVar9);
        }
        else {
          uVar5 = *(undefined7 *)&pvVar9->field_0x11;
          (local_188.
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish)->search_match = pvVar9->search_match;
          *(undefined7 *)
           &(local_188.
             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_finish)->field_0x11 = uVar5;
          uVar5 = *(undefined7 *)&pvVar9->field_0x1;
          sVar4 = pvVar9->start;
          (local_188.
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish)->type = pvVar9->type;
          *(undefined7 *)
           &(local_188.
             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_finish)->field_0x1 = uVar5;
          (local_188.
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish)->start = sVar4;
          local_188.
          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_188.
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        __n = __n + 1;
        phVar16 = (tokens->
                  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (__n < (ulong)(((long)(tokens->
                                    super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                    ).
                                    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)phVar16 >> 3)
                            * -0x5555555555555555));
    }
    (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_188.
         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl
         .super__Vector_impl_data._M_start;
    (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_188.
         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl
         .super__Vector_impl_data._M_finish;
    (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_188.
         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    local_188.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((phVar16 != (pointer)0x0) &&
       (operator_delete(phVar16),
       local_188.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
       ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_188.
                      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_f8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_148.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_148.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (ulong *)0x0) {
    operator_delete(local_d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (ulong *)0x0) {
    operator_delete(local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((duckdb *)
      local_a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (duckdb *)0x0) {
    operator_delete(local_a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((duckdb *)
      local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (duckdb *)0x0) {
    operator_delete(local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((duckdb *)
      local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (duckdb *)0x0) {
    operator_delete(local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
LAB_0021a430:
  if ((uVar13 < 5) && ((0x16U >> uVar13 & 1) != 0)) {
    if (local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_128,
                 (iterator)
                 local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,(unsigned_long *)&local_150);
    }
    else {
      *local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish = (unsigned_long)local_150;
      local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  goto LAB_0021a46d;
code_r0x0021a73b:
  pvVar9 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n);
  if (local_188.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_188.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
    _M_realloc_insert<duckdb::highlightToken_const&>
              ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)&local_188,
               (iterator)
               local_188.
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_finish,pvVar9);
  }
  else {
    uVar5 = *(undefined7 *)&pvVar9->field_0x11;
    (local_188.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
     _M_impl.super__Vector_impl_data._M_finish)->search_match = pvVar9->search_match;
    *(undefined7 *)
     &(local_188.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
       ._M_impl.super__Vector_impl_data._M_finish)->field_0x11 = uVar5;
    uVar5 = *(undefined7 *)&pvVar9->field_0x1;
    sVar4 = pvVar9->start;
    (local_188.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
     _M_impl.super__Vector_impl_data._M_finish)->type = pvVar9->type;
    *(undefined7 *)
     &(local_188.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
       ._M_impl.super__Vector_impl_data._M_finish)->field_0x1 = uVar5;
    (local_188.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
     _M_impl.super__Vector_impl_data._M_finish)->start = sVar4;
    local_188.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_188.
         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl
         .super__Vector_impl_data._M_finish + 1;
  }
  __n = __n + 1;
  if ((ulong)(((long)(tokens->
                     super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                     super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(tokens->
                     super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                     super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <= __n)
  goto LAB_0021a7a1;
  goto LAB_0021a726;
}

Assistant:

void Linenoise::AddErrorHighlighting(idx_t render_start, idx_t render_end, vector<highlightToken> &tokens) const {
	static constexpr const idx_t MAX_ERROR_LENGTH = 2000;
	if (!enableErrorRendering) {
		return;
	}
	if (len >= MAX_ERROR_LENGTH) {
		return;
	}
	// do a pass over the buffer to collect errors:
	// * brackets without matching closing/opening bracket
	// * single quotes without matching closing single quote
	// * double quote without matching double quote
	ScanState state = ScanState::STANDARD;
	vector<idx_t> brackets;        // ()
	vector<idx_t> square_brackets; // []
	vector<idx_t> curly_brackets;  // {}
	vector<idx_t> errors;
	vector<idx_t> cursor_brackets;
	vector<idx_t> comment_start;
	vector<idx_t> comment_end;
	string dollar_quote_marker;
	idx_t quote_pos = 0;
	for (idx_t i = 0; i < len; i++) {
		auto c = buf[i];
		switch (state) {
		case ScanState::STANDARD:
			switch (c) {
			case '-':
				if (i + 1 < len && buf[i + 1] == '-') {
					// -- puts us in a comment
					comment_start.push_back(i);
					i++;
					state = ScanState::IN_COMMENT;
					break;
				}
				break;
			case '\'':
				state = ScanState::IN_SINGLE_QUOTE;
				quote_pos = i;
				break;
			case '\"':
				state = ScanState::IN_DOUBLE_QUOTE;
				quote_pos = i;
				break;
			case '(':
				OpenBracket(brackets, cursor_brackets, pos, i);
				break;
			case '[':
				OpenBracket(square_brackets, cursor_brackets, pos, i);
				break;
			case '{':
				OpenBracket(curly_brackets, cursor_brackets, pos, i);
				break;
			case ')':
				CloseBracket(brackets, cursor_brackets, pos, i, errors);
				break;
			case ']':
				CloseBracket(square_brackets, cursor_brackets, pos, i, errors);
				break;
			case '}':
				CloseBracket(curly_brackets, cursor_brackets, pos, i, errors);
				break;
			case '$': { // dollar symbol
				if (i + 1 >= len) {
					// we need more than just a dollar
					break;
				}
				// check if this is a dollar-quoted string
				idx_t next_dollar = 0;
				for (idx_t idx = i + 1; idx < len; idx++) {
					if (buf[idx] == '$') {
						// found the next dollar
						next_dollar = idx;
						break;
					}
					// all characters can be between A-Z, a-z or \200 - \377
					if (buf[idx] >= 'A' && buf[idx] <= 'Z') {
						continue;
					}
					if (buf[idx] >= 'a' && buf[idx] <= 'z') {
						continue;
					}
					if (buf[idx] >= '\200' && buf[idx] <= '\377') {
						continue;
					}
					// the first character CANNOT be a numeric, only subsequent characters
					if (idx > i + 1 && buf[idx] >= '0' && buf[idx] <= '9') {
						continue;
					}
					// not a dollar quoted string
					break;
				}
				if (next_dollar == 0) {
					// not a dollar quoted string
					break;
				}
				// dollar quoted string
				state = ScanState::DOLLAR_QUOTED_STRING;
				quote_pos = i;
				i = next_dollar;
				if (i < len) {
					// found a complete marker - store it
					idx_t marker_start = quote_pos + 1;
					dollar_quote_marker = string(buf + marker_start, i - marker_start);
				}
				break;
			}
			default:
				break;
			}
			break;
		case ScanState::IN_COMMENT:
			// comment state - the only thing that will get us out is a newline
			switch (c) {
			case '\r':
			case '\n':
				// newline - left comment state
				state = ScanState::STANDARD;
				comment_end.push_back(i);
				break;
			default:
				break;
			}
			break;
		case ScanState::IN_SINGLE_QUOTE:
			// single quote - all that will get us out is an unescaped single-quote
			if (c == '\'') {
				if (i + 1 < len && buf[i + 1] == '\'') {
					// double single-quote means the quote is escaped - continue
					i++;
					break;
				} else {
					// otherwise revert to standard scan state
					state = ScanState::STANDARD;
					break;
				}
			}
			break;
		case ScanState::IN_DOUBLE_QUOTE:
			// double quote - all that will get us out is an unescaped quote
			if (c == '"') {
				if (i + 1 < len && buf[i + 1] == '"') {
					// double quote means the quote is escaped - continue
					i++;
					break;
				} else {
					// otherwise revert to standard scan state
					state = ScanState::STANDARD;
					break;
				}
			}
			break;
		case ScanState::DOLLAR_QUOTED_STRING: {
			// dollar-quoted string - all that will get us out is a $[marker]$
			if (c != '$') {
				break;
			}
			if (i + 1 >= len) {
				// no room for the final dollar
				break;
			}
			// skip to the next dollar symbol
			idx_t start = i + 1;
			idx_t end = start;
			while (end < len && buf[end] != '$') {
				end++;
			}
			if (end >= len) {
				// no final dollar found - continue as normal
				break;
			}
			if (end - start != dollar_quote_marker.size()) {
				// length mismatch - cannot match
				break;
			}
			if (memcmp(buf + start, dollar_quote_marker.c_str(), dollar_quote_marker.size()) != 0) {
				// marker mismatch
				break;
			}
			// marker found! revert to standard state
			dollar_quote_marker = string();
			state = ScanState::STANDARD;
			i = end;
			break;
		}
		default:
			break;
		}
	}
	if (state == ScanState::IN_DOUBLE_QUOTE || state == ScanState::IN_SINGLE_QUOTE ||
	    state == ScanState::DOLLAR_QUOTED_STRING) {
		// quote is never closed
		errors.push_back(quote_pos);
	}
	HandleBracketErrors(brackets, errors);
	HandleBracketErrors(square_brackets, errors);
	HandleBracketErrors(curly_brackets, errors);

	// insert all the errors for highlighting
	for (auto &error : errors) {
		Linenoise::Log("Error found at position %llu\n", error);
		if (error < render_start || error > render_end) {
			continue;
		}
		auto render_error = error - render_start;
		InsertToken(tokenType::TOKEN_ERROR, render_error, tokens);
	}
	if (cursor_brackets.size() != 2) {
		// no matching cursor brackets found
		cursor_brackets.clear();
	}
	// insert bracket for highlighting
	for (auto &bracket_position : cursor_brackets) {
		Linenoise::Log("Highlight bracket at position %d\n", bracket_position);
		if (bracket_position < render_start || bracket_position > render_end) {
			continue;
		}

		idx_t render_position = bracket_position - render_start;
		InsertToken(tokenType::TOKEN_BRACKET, render_position, tokens);
	}
	// insert comments
	if (!comment_start.empty()) {
		vector<highlightToken> new_tokens;
		new_tokens.reserve(tokens.size());
		idx_t token_idx = 0;
		for (idx_t c = 0; c < comment_start.size(); c++) {
			auto c_start = comment_start[c];
			auto c_end = c < comment_end.size() ? comment_end[c] : len;
			if (c_start < render_start || c_end > render_end) {
				continue;
			}
			Linenoise::Log("Comment at position %d to %d\n", c_start, c_end);
			c_start -= render_start;
			c_end -= render_start;
			bool inserted_comment = false;

			highlightToken comment_token;
			comment_token.start = c_start;
			comment_token.type = tokenType::TOKEN_COMMENT;
			comment_token.search_match = false;

			for (; token_idx < tokens.size(); token_idx++) {
				if (tokens[token_idx].start >= c_start) {
					// insert the comment here
					new_tokens.push_back(comment_token);
					inserted_comment = true;
					break;
				}
				new_tokens.push_back(tokens[token_idx]);
			}
			if (!inserted_comment) {
				new_tokens.push_back(comment_token);
			} else {
				// skip all tokens until we exit the comment again
				for (; token_idx < tokens.size(); token_idx++) {
					if (tokens[token_idx].start > c_end) {
						break;
					}
				}
			}
		}
		for (; token_idx < tokens.size(); token_idx++) {
			new_tokens.push_back(tokens[token_idx]);
		}
		tokens = std::move(new_tokens);
	}
}